

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_rr_move_dir(archive_write *a,isoent **rr_moved,isoent *curent,isoent **newent)

{
  iso9660_conflict *iso9660_00;
  archive_entry *paVar1;
  uint uVar2;
  isoent *piVar3;
  isoent *rootent;
  isoent *np;
  isoent *mvent;
  isoent *rrmoved;
  iso9660_conflict *iso9660;
  isoent **newent_local;
  isoent *curent_local;
  isoent **rr_moved_local;
  archive_write *a_local;
  
  iso9660_00 = (iso9660_conflict *)a->format_data;
  mvent = *rr_moved;
  if (mvent == (isoent *)0x0) {
    piVar3 = (iso9660_00->primary).rootent;
    mvent = isoent_create_virtual_dir(a,iso9660_00,"rr_moved");
    if (mvent == (isoent *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
      return -0x1e;
    }
    isoent_add_child_head(piVar3,mvent);
    paVar1 = piVar3->file->entry;
    uVar2 = archive_entry_nlink(piVar3->file->entry);
    archive_entry_set_nlink(paVar1,uVar2 + 1);
    path_table_add_entry((iso9660_00->primary).pathtbl + 1,mvent);
    *rr_moved = mvent;
  }
  piVar3 = isoent_clone(curent);
  if (piVar3 == (isoent *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    piVar3->rr_parent = curent->parent;
    curent->rr_child = piVar3;
    if ((curent->children).first != (isoent *)0x0) {
      *(piVar3->children).last = (curent->children).first;
      (piVar3->children).last = (curent->children).last;
    }
    for (rootent = (piVar3->children).first; rootent != (isoent *)0x0; rootent = rootent->chnext) {
      rootent->parent = piVar3;
    }
    (piVar3->children).cnt = (curent->children).cnt;
    (curent->children).cnt = 0;
    (curent->children).first = (isoent *)0x0;
    (curent->children).last = &(curent->children).first;
    if ((curent->subdirs).first != (isoent *)0x0) {
      *(piVar3->subdirs).last = (curent->subdirs).first;
      (piVar3->subdirs).last = (curent->subdirs).last;
    }
    (piVar3->subdirs).cnt = (curent->subdirs).cnt;
    (curent->subdirs).cnt = 0;
    (curent->subdirs).first = (isoent *)0x0;
    (curent->subdirs).last = &(curent->subdirs).first;
    isoent_add_child_tail(mvent,piVar3);
    paVar1 = mvent->file->entry;
    uVar2 = archive_entry_nlink(mvent->file->entry);
    archive_entry_set_nlink(paVar1,uVar2 + 1);
    curent->field_0xe8 = curent->field_0xe8 & 0xfd;
    *newent = piVar3;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
isoent_rr_move_dir(struct archive_write *a, struct isoent **rr_moved,
    struct isoent *curent, struct isoent **newent)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *rrmoved, *mvent, *np;

	if ((rrmoved = *rr_moved) == NULL) {
		struct isoent *rootent = iso9660->primary.rootent;
		/* There isn't rr_move entry.
		 * Create rr_move entry and insert it into the root entry.
		 */
		rrmoved = isoent_create_virtual_dir(a, iso9660, "rr_moved");
		if (rrmoved == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		/* Add "rr_moved" entry to the root entry. */
		isoent_add_child_head(rootent, rrmoved);
		archive_entry_set_nlink(rootent->file->entry,
		    archive_entry_nlink(rootent->file->entry) + 1);
		/* Register "rr_moved" entry to second level pathtable. */
		path_table_add_entry(&(iso9660->primary.pathtbl[1]), rrmoved);
		/* Save rr_moved. */
		*rr_moved = rrmoved;
	}
	/*
	 * Make a clone of curent which is going to be relocated
	 * to rr_moved.
	 */
	mvent = isoent_clone(curent);
	if (mvent == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	/* linking..  and use for creating "CL", "PL" and "RE" */
	mvent->rr_parent = curent->parent;
	curent->rr_child = mvent;
	/*
	 * Move subdirectories from the curent to mvent
	 */
	if (curent->children.first != NULL) {
		*mvent->children.last = curent->children.first;
		mvent->children.last = curent->children.last;
	}
	for (np = mvent->children.first; np != NULL; np = np->chnext)
		np->parent = mvent;
	mvent->children.cnt = curent->children.cnt;
	curent->children.cnt = 0;
	curent->children.first = NULL;
	curent->children.last = &curent->children.first;

	if (curent->subdirs.first != NULL) {
		*mvent->subdirs.last = curent->subdirs.first;
		mvent->subdirs.last = curent->subdirs.last;
	}
	mvent->subdirs.cnt = curent->subdirs.cnt;
	curent->subdirs.cnt = 0;
	curent->subdirs.first = NULL;
	curent->subdirs.last = &curent->subdirs.first;

	/*
	 * The mvent becomes a child of the rr_moved entry.
	 */
	isoent_add_child_tail(rrmoved, mvent);
	archive_entry_set_nlink(rrmoved->file->entry,
	    archive_entry_nlink(rrmoved->file->entry) + 1);
	/*
	 * This entry which relocated to the rr_moved directory
	 * has to set the flag as a file.
	 * See also RRIP 4.1.5.1 Description of the "CL" System Use Entry.
	 */
	curent->dir = 0;

	*newent = mvent;

	return (ARCHIVE_OK);
}